

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationElementIterator::next(CollationElementIterator *this,UErrorCode *status)

{
  uint32_t uVar1;
  CollationIterator *this_00;
  uint uVar2;
  int64_t iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = 0xffffffff;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->dir_ < '\x02') {
      if (1 < (byte)this->dir_) {
        *status = U_INVALID_STATE_ERROR;
        return -1;
      }
      this->dir_ = '\x02';
    }
    else {
      uVar1 = this->otherHalf_;
      if (uVar1 != 0) {
        this->otherHalf_ = 0;
        return uVar1;
      }
    }
    this_00 = this->iter_;
    if (this_00->cesIndex == (this_00->ceBuffer).length) {
      (this_00->ceBuffer).length = 0;
      this_00->cesIndex = 0;
    }
    iVar3 = CollationIterator::nextCE(this_00,status);
    if (iVar3 != 0x101000100) {
      uVar4 = (uint)((ulong)iVar3 >> 0x20);
      uVar2 = (uint)((ulong)iVar3 >> 8);
      uVar5 = uVar2 & 0xff | (uint)((ulong)iVar3 >> 0x10) & 0xff00 | uVar4 & 0xffff0000;
      uVar2 = (uint)iVar3 & 0x3f | uVar2 & 0xff00 | uVar4 << 0x10;
      if (uVar2 != 0) {
        this->otherHalf_ = uVar2 | 0xc0;
      }
    }
  }
  return uVar5;
}

Assistant:

int32_t CollationElementIterator::next(UErrorCode& status)
{
    if (U_FAILURE(status)) { return NULLORDER; }
    if (dir_ > 1) {
        // Continue forward iteration. Test this first.
        if (otherHalf_ != 0) {
            uint32_t oh = otherHalf_;
            otherHalf_ = 0;
            return oh;
        }
    } else if (dir_ == 1) {
        // next() after setOffset()
        dir_ = 2;
    } else if (dir_ == 0) {
        // The iter_ is already reset to the start of the text.
        dir_ = 2;
    } else /* dir_ < 0 */ {
        // illegal change of direction
        status = U_INVALID_STATE_ERROR;
        return NULLORDER;
    }
    // No need to keep all CEs in the buffer when we iterate.
    iter_->clearCEsIfNoneRemaining();
    int64_t ce = iter_->nextCE(status);
    if (ce == Collation::NO_CE) { return NULLORDER; }
    // Turn the 64-bit CE into two old-style 32-bit CEs, without quaternary bits.
    uint32_t p = (uint32_t)(ce >> 32);
    uint32_t lower32 = (uint32_t)ce;
    uint32_t firstHalf = getFirstHalf(p, lower32);
    uint32_t secondHalf = getSecondHalf(p, lower32);
    if (secondHalf != 0) {
        otherHalf_ = secondHalf | 0xc0;  // continuation CE
    }
    return firstHalf;
}